

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

StringPtr * __thiscall
kj::
Table<kj::HashMap<unsigned_long,_kj::StringPtr>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_kj::StringPtr>::Callbacks>_>
::insert(Table<kj::HashMap<unsigned_long,_kj::StringPtr>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_kj::StringPtr>::Callbacks>_>
         *this,StringPtr *row)

{
  StringPtr *pSVar1;
  undefined8 *puVar2;
  size_t sVar3;
  Impl<0UL,_false> local_28 [16];
  
  Impl<0UL,_false>::insert
            (local_28,(Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                       *)this,(*(long *)(this + 8) - *(long *)this >> 3) * -0x5555555555555555,row,
             0xffffffff);
  if (local_28[0] != (Impl<0UL,_false>)0x1) {
    puVar2 = *(undefined8 **)(this + 8);
    if (puVar2 == *(undefined8 **)(this + 0x10)) {
      sVar3 = 4;
      if (puVar2 != *(undefined8 **)this) {
        sVar3 = ((long)puVar2 - (long)*(undefined8 **)this >> 3) * 0x5555555555555556;
      }
      Vector<kj::HashMap<unsigned_long,_kj::StringPtr>::Entry>::setCapacity
                ((Vector<kj::HashMap<unsigned_long,_kj::StringPtr>::Entry> *)this,sVar3);
      puVar2 = *(undefined8 **)(this + 8);
    }
    puVar2[2] = row[1].content.ptr;
    sVar3 = (row->content).size_;
    *puVar2 = (row->content).ptr;
    puVar2[1] = sVar3;
    pSVar1 = *(StringPtr **)(this + 8);
    *(size_t **)(this + 8) = &pSVar1[1].content.size_;
    return pSVar1;
  }
  _::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  if (kj::none != Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }
}